

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.cpp
# Opt level: O3

unique_ptr<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_> __thiscall
jaegertracing::Tracer::StartSpanWithOptions
          (Tracer *this,string_view operationName,StartSpanOptions *options)

{
  pointer *ppTVar1;
  element_type *peVar2;
  _Tuple_impl<0UL,_opentracing::v3::Span_*,_std::default_delete<opentracing::v3::Span>_> _Var3;
  uint64_t spanID;
  uint64_t uVar4;
  long lVar5;
  long lVar6;
  invalid_argument *this_00;
  size_t sVar7;
  pointer pcVar8;
  pointer pcVar9;
  byte bVar10;
  Tracer *this_01;
  long *in_R8;
  uchar uVar11;
  string local_4a0;
  _Tuple_impl<0UL,_opentracing::v3::Span_*,_std::default_delete<opentracing::v3::Span>_> local_480;
  TraceID traceID;
  SamplingStatus samplingStatus;
  variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
  local_430;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> samplerTags;
  undefined1 local_3e8 [8];
  AnalyzedReferences result;
  SpanContext ctx;
  SpanContext local_240;
  SpanContext local_190;
  SpanContext local_e0;
  
  sVar7 = operationName.length_;
  this_01 = (Tracer *)operationName.data_;
  local_480.super__Head_base<0UL,_opentracing::v3::Span_*,_false>._M_head_impl =
       (_Head_base<0UL,_opentracing::v3::Span_*,_false>)
       (_Head_base<0UL,_opentracing::v3::Span_*,_false>)this;
  analyzeReferences(&result,this_01,
                    (vector<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>,_std::allocator<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>_>_>
                     *)(in_R8 + 2));
  if ((result._self != (SpanContext *)0x0) &&
     ((result._parent != (SpanContext *)0x0 ||
      (result._references.
       super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>.
       _M_impl.super__Vector_impl_data._M_start !=
       result._references.
       super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>.
       _M_impl.super__Vector_impl_data._M_finish)))) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"Self and references are exclusive. Only one of them can be specified");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  samplerTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  samplerTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  samplerTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ctx._baggage._M_h._M_buckets = &ctx._baggage._M_h._M_single_bucket;
  ctx.super_SpanContext._vptr_SpanContext = (_func_int **)&PTR__SpanContext_00264a78;
  ctx._traceID._high = 0;
  ctx._traceID._low = 0;
  ctx._spanID = 0;
  ctx._parentID = 0;
  ctx._flags = '\0';
  ctx._baggage._M_h._M_bucket_count = 1;
  ctx._baggage._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ctx._baggage._M_h._M_element_count = 0;
  ctx._baggage._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  ctx._baggage._M_h._M_rehash_policy._M_next_resize = 0;
  ctx._baggage._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ctx._debugID._M_dataplus._M_p = (pointer)&ctx._debugID.field_2;
  ctx._debugID._M_string_length = 0;
  ctx._debugID.field_2._M_local_buf[0] = '\0';
  ctx._mutex.super___mutex_base._M_mutex.__align = 0;
  ctx._mutex.super___mutex_base._M_mutex._8_8_ = 0;
  ctx._mutex.super___mutex_base._M_mutex._16_8_ = 0;
  ctx._mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  ctx._mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  if (((result._parent == (SpanContext *)0x0) ||
      (((result._parent)->_traceID)._low == 0 && ((result._parent)->_traceID)._high == 0)) ||
     ((result._parent)->_spanID == 0)) {
    if (result._self == (SpanContext *)0x0) {
      if ((this_01->_options & 1) == 0) {
        traceID._high = 0;
      }
      else {
        traceID._high = randomID(this_01);
      }
      uVar4 = randomID(this_01);
      traceID._low = uVar4;
    }
    else {
      traceID._high = ((result._self)->_traceID)._high;
      uVar4 = (result._self)->_spanID;
      traceID._low = ((result._self)->_traceID)._low;
    }
    if (((result._parent == (SpanContext *)0x0) || (((result._parent)->_traceID)._high != 0)) ||
       ((((result._parent)->_traceID)._low != 0 ||
        (((result._parent)->_debugID)._M_string_length == 0)))) {
      peVar2 = (this_01->_sampler).
               super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_4a0,sVar7,(long)&(options->start_system_timestamp).__d.__r + sVar7
                );
      (*peVar2->_vptr_Sampler[2])(&samplingStatus,peVar2,&traceID);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
        operator_delete(local_4a0._M_dataplus._M_p);
      }
      uVar11 = samplingStatus._isSampled == true;
      if ((bool)uVar11) {
        std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::operator=
                  (&samplerTags,&samplingStatus._tags);
      }
      std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
                (&samplingStatus._tags);
    }
    else {
      local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a0,"jaeger-debug-id","");
      Tag::Tag<std::__cxx11::string_const&>
                ((Tag *)&samplingStatus,&local_4a0,&(result._parent)->_debugID);
      std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::
      emplace_back<jaegertracing::Tag>(&samplerTags,(Tag *)&samplingStatus);
      opentracing::v3::util::
      variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
      ::~variant(&local_430);
      if ((pointer *)samplingStatus._0_8_ !=
          &samplingStatus._tags.
           super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
           super__Vector_impl_data._M_finish) {
        operator_delete((void *)samplingStatus._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
        operator_delete(local_4a0._M_dataplus._M_p);
      }
      uVar11 = '\x03';
    }
    samplingStatus._0_8_ = (long)&local_430.data + 8;
    samplingStatus._tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
    samplingStatus._tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    samplingStatus._tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_430.type_index = 0x3f800000;
    local_430.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_430.data._8_8_ = (__node_base_ptr)0x0;
    local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a0,"");
    SpanContext::SpanContext(&local_e0,&traceID,uVar4,0,uVar11,(StrMap *)&samplingStatus,&local_4a0)
    ;
    SpanContext::swap(&ctx,&local_e0);
    local_e0.super_SpanContext._vptr_SpanContext = (_func_int **)&PTR__SpanContext_00264a78;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._debugID._M_dataplus._M_p != &local_e0._debugID.field_2) {
      operator_delete(local_e0._debugID._M_dataplus._M_p);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_e0._baggage._M_h);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
      operator_delete(local_4a0._M_dataplus._M_p);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&samplingStatus);
    bVar10 = 1;
    if (result._parent == (SpanContext *)0x0) goto LAB_001b8f67;
  }
  else {
    traceID._high = ((result._parent)->_traceID)._high;
    traceID._low = ((result._parent)->_traceID)._low;
    spanID = randomID(this_01);
    uVar4 = (result._parent)->_spanID;
    uVar11 = (result._parent)->_flags;
    samplingStatus._0_8_ = (long)&local_430.data + 8;
    samplingStatus._tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
    samplingStatus._tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    samplingStatus._tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_430.type_index = 0x3f800000;
    local_430.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_430.data._8_8_ = (__node_base_ptr)0x0;
    local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a0,"");
    SpanContext::SpanContext
              (&local_190,&traceID,spanID,uVar4,uVar11,(StrMap *)&samplingStatus,&local_4a0);
    SpanContext::swap(&ctx,&local_190);
    local_190.super_SpanContext._vptr_SpanContext = (_func_int **)&PTR__SpanContext_00264a78;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._debugID._M_dataplus._M_p != &local_190._debugID.field_2) {
      operator_delete(local_190._debugID._M_dataplus._M_p);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_190._baggage._M_h);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
      operator_delete(local_4a0._M_dataplus._M_p);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&samplingStatus);
    bVar10 = 0;
  }
  if (((result._parent)->_baggage)._M_h._M_element_count != 0) {
    SpanContext::withBaggage(&local_240,&ctx,&(result._parent)->_baggage);
    SpanContext::swap(&ctx,&local_240);
    local_240.super_SpanContext._vptr_SpanContext = (_func_int **)&PTR__SpanContext_00264a78;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._debugID._M_dataplus._M_p != &local_240._debugID.field_2) {
      operator_delete(local_240._debugID._M_dataplus._M_p);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_240._baggage._M_h);
  }
LAB_001b8f67:
  pcVar9 = (pointer)*in_R8;
  pcVar8 = (pointer)in_R8[1];
  if (pcVar9 == (pointer)0x0) {
    if (pcVar8 == (pointer)0x0) {
      pcVar9 = (pointer)std::chrono::_V2::system_clock::now();
      pcVar8 = (pointer)std::chrono::_V2::steady_clock::now();
    }
    else {
      lVar5 = std::chrono::_V2::steady_clock::now();
      lVar6 = std::chrono::_V2::system_clock::now();
      pcVar9 = pcVar8 + (lVar6 - lVar5);
      pcVar8 = (pointer)in_R8[1];
    }
  }
  else if (pcVar8 == (pointer)0x0) {
    lVar5 = std::chrono::_V2::system_clock::now();
    lVar6 = std::chrono::_V2::steady_clock::now();
    pcVar8 = pcVar9 + (lVar6 - lVar5);
    pcVar9 = (pointer)*in_R8;
  }
  ppTVar1 = &samplingStatus._tags.
             super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_4a0._M_dataplus._M_p = pcVar9;
  traceID._high = (uint64_t)pcVar8;
  samplingStatus._0_8_ = ppTVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&samplingStatus,sVar7,
             (long)&(options->start_system_timestamp).__d.__r + sVar7);
  startSpanInternal((Tracer *)local_3e8,(SpanContext *)this_01,(string *)&ctx,
                    (time_point *)&samplingStatus,(time_point *)&local_4a0,
                    (vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)&traceID,
                    (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>
                     *)&samplerTags,(bool)((char)in_R8 + '('),
                    (vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> *)
                    (ulong)bVar10);
  _Var3.super__Head_base<0UL,_opentracing::v3::Span_*,_false>._M_head_impl =
       local_480.super__Head_base<0UL,_opentracing::v3::Span_*,_false>._M_head_impl;
  *(undefined1 (*) [8])local_480.super__Head_base<0UL,_opentracing::v3::Span_*,_false>._M_head_impl
       = local_3e8;
  if ((pointer *)samplingStatus._0_8_ != ppTVar1) {
    operator_delete((void *)samplingStatus._0_8_);
  }
  ctx.super_SpanContext._vptr_SpanContext = (_func_int **)&PTR__SpanContext_00264a78;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ctx._debugID._M_dataplus._M_p != &ctx._debugID.field_2) {
    operator_delete(ctx._debugID._M_dataplus._M_p);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&ctx._baggage._M_h);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&samplerTags);
  std::vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>::~vector
            (&result._references);
  return (unique_ptr<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_>)
         (Span *)_Var3.super__Head_base<0UL,_opentracing::v3::Span_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<opentracing::Span>
Tracer::StartSpanWithOptions(string_view operationName,
                             const opentracing::StartSpanOptions& options) const
    noexcept
{
    try {
        const auto result = analyzeReferences(options.references);
        const auto* parent = result._parent;
        const auto* self = result._self;
        const auto& references = result._references;
        if (self && (parent || !references.empty()))
        {
            throw std::invalid_argument("Self and references are exclusive. Only one of them can be specified");
        }

        std::vector<Tag> samplerTags;
        auto newTrace = false;
        SpanContext ctx;
        if (!parent || !parent->isValid()) {
            newTrace = true;
            auto highID = static_cast<uint64_t>(0);
            auto lowID = static_cast<uint64_t>(0);
            if (self) {
                highID = self->traceID().high();
                lowID = self->traceID().low();
            }
            else {
                if (_options & kGen128BitOption) {
                    highID = randomID();
                }
                lowID = randomID();
            }
            const TraceID traceID(highID, lowID);
            const auto spanID = self ? self->spanID() : traceID.low();
            const auto parentID = 0;
            auto flags = static_cast<unsigned char>(0);
            if (parent && parent->isDebugIDContainerOnly()) {
                flags |=
                    (static_cast<unsigned char>(SpanContext::Flag::kSampled) |
                     static_cast<unsigned char>(SpanContext::Flag::kDebug));
                samplerTags.push_back(Tag(kJaegerDebugHeader, parent->debugID()));
            }
            else {
                const auto samplingStatus =
                    _sampler->isSampled(traceID, operationName);
                if (samplingStatus.isSampled()) {
                    flags |=
                        static_cast<unsigned char>(SpanContext::Flag::kSampled);
                    samplerTags = samplingStatus.tags();
                }
            }
            ctx = SpanContext(traceID, spanID, parentID, flags, StrMap());
        }
        else {
            const auto traceID = parent->traceID();
            const auto spanID = randomID();
            const auto parentID = parent->spanID();
            const auto flags = parent->flags();
            ctx = SpanContext(traceID, spanID, parentID, flags, StrMap());
        }

        if (parent && !parent->baggage().empty()) {
            ctx = ctx.withBaggage(parent->baggage());
        }

        SystemClock::time_point startTimeSystem;
        SteadyClock::time_point startTimeSteady;
        std::tie(startTimeSystem, startTimeSteady) =
            determineStartTimes(options);
        return startSpanInternal(ctx,
                                 operationName,
                                 startTimeSystem,
                                 startTimeSteady,
                                 samplerTags,
                                 options.tags,
                                 newTrace,
                                 references);
    } catch (const std::exception& ex) {
        std::ostringstream oss;
        oss << "Error occurred in Tracer::StartSpanWithOptions: " << ex.what();
        utils::ErrorUtil::logError(*_logger, oss.str());
        return nullptr;
    } catch (...) {
        utils::ErrorUtil::logError(
            *_logger, "Error occurred in Tracer::StartSpanWithOptions");
        return nullptr;
    }
}